

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pred_common.c
# Opt level: O0

int av1_get_palette_cache(MACROBLOCKD *xd,int plane,uint16_t *cache)

{
  ushort val_00;
  ushort val_01;
  bool bVar1;
  uint uVar2;
  long lVar3;
  uint16_t *in_RDX;
  int in_ESI;
  long in_RDI;
  uint16_t val_1;
  uint16_t val;
  uint16_t v_left;
  uint16_t v_above;
  uint16_t *left_colors;
  uint16_t *above_colors;
  int n;
  int left_idx;
  int above_idx;
  int left_n;
  int above_n;
  MB_MODE_INFO *left_mi;
  MB_MODE_INFO *above_mi;
  int row;
  long local_80;
  long local_78;
  long local_70;
  int local_4c;
  int local_48;
  int local_44;
  uint local_40;
  uint local_3c;
  long local_38;
  long local_30;
  int local_24;
  uint16_t *local_20;
  int local_4;
  
  local_24 = -*(int *)(in_RDI + 0x1efc) >> 3;
  if (local_24 % 0x40 == 0) {
    local_70 = 0;
  }
  else {
    local_70 = *(long *)(in_RDI + 0x1ed0);
  }
  local_30 = local_70;
  local_38 = *(long *)(in_RDI + 0x1ec8);
  local_3c = 0;
  local_40 = 0;
  if (local_70 != 0) {
    local_3c = (uint)*(byte *)(local_70 + 0x8e + (long)(int)(uint)(in_ESI != 0));
  }
  if (local_38 != 0) {
    local_40 = (uint)*(byte *)(local_38 + 0x8e + (long)(int)(uint)(in_ESI != 0));
  }
  if ((local_3c == 0) && (local_40 == 0)) {
    local_4 = 0;
  }
  else {
    local_44 = in_ESI << 3;
    local_48 = in_ESI << 3;
    local_4c = 0;
    if (local_70 == 0) {
      local_78 = 0;
    }
    else {
      local_78 = local_70 + 0x5e;
    }
    local_20 = in_RDX;
    if (local_38 == 0) {
      local_80 = 0;
    }
    else {
      local_80 = local_38 + 0x5e;
    }
    while (0 < (int)local_3c && 0 < (int)local_40) {
      val_00 = *(ushort *)(local_78 + (long)local_44 * 2);
      val_01 = *(ushort *)(local_80 + (long)local_48 * 2);
      if (val_01 < val_00) {
        palette_add_to_cache(local_20,&local_4c,val_01);
        local_48 = local_48 + 1;
        local_40 = local_40 - 1;
      }
      else {
        palette_add_to_cache(local_20,&local_4c,val_00);
        local_44 = local_44 + 1;
        local_3c = local_3c - 1;
        if (val_01 == val_00) {
          local_48 = local_48 + 1;
          local_40 = local_40 - 1;
        }
      }
    }
    while (uVar2 = local_3c - 1, bVar1 = 0 < (int)local_3c, local_3c = uVar2, bVar1) {
      lVar3 = (long)local_44;
      local_44 = local_44 + 1;
      palette_add_to_cache(local_20,&local_4c,*(uint16_t *)(local_78 + lVar3 * 2));
    }
    while (0 < (int)local_40) {
      lVar3 = (long)local_48;
      local_48 = local_48 + 1;
      local_40 = local_40 - 1;
      palette_add_to_cache(local_20,&local_4c,*(uint16_t *)(local_80 + lVar3 * 2));
    }
    local_4 = local_4c;
  }
  return local_4;
}

Assistant:

int av1_get_palette_cache(const MACROBLOCKD *const xd, int plane,
                          uint16_t *cache) {
  const int row = -xd->mb_to_top_edge >> 3;
  // Do not refer to above SB row when on SB boundary.
  const MB_MODE_INFO *const above_mi =
      (row % (1 << MIN_SB_SIZE_LOG2)) ? xd->above_mbmi : NULL;
  const MB_MODE_INFO *const left_mi = xd->left_mbmi;
  int above_n = 0, left_n = 0;
  if (above_mi) above_n = above_mi->palette_mode_info.palette_size[plane != 0];
  if (left_mi) left_n = left_mi->palette_mode_info.palette_size[plane != 0];
  if (above_n == 0 && left_n == 0) return 0;
  int above_idx = plane * PALETTE_MAX_SIZE;
  int left_idx = plane * PALETTE_MAX_SIZE;
  int n = 0;
  const uint16_t *above_colors =
      above_mi ? above_mi->palette_mode_info.palette_colors : NULL;
  const uint16_t *left_colors =
      left_mi ? left_mi->palette_mode_info.palette_colors : NULL;
  // Merge the sorted lists of base colors from above and left to get
  // combined sorted color cache.
  while (above_n > 0 && left_n > 0) {
    uint16_t v_above = above_colors[above_idx];
    uint16_t v_left = left_colors[left_idx];
    if (v_left < v_above) {
      palette_add_to_cache(cache, &n, v_left);
      ++left_idx, --left_n;
    } else {
      palette_add_to_cache(cache, &n, v_above);
      ++above_idx, --above_n;
      if (v_left == v_above) ++left_idx, --left_n;
    }
  }
  while (above_n-- > 0) {
    uint16_t val = above_colors[above_idx++];
    palette_add_to_cache(cache, &n, val);
  }
  while (left_n-- > 0) {
    uint16_t val = left_colors[left_idx++];
    palette_add_to_cache(cache, &n, val);
  }
  assert(n <= 2 * PALETTE_MAX_SIZE);
  return n;
}